

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::IsIn(Var argProperty,Var instance,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  PropertyRecord *pPVar3;
  bool bVar4;
  BOOL BVar5;
  uint32 uVar6;
  IndexType IVar7;
  RecyclableObject *instance_00;
  undefined4 extraout_var;
  undefined4 *puVar8;
  PropertyRecord *pPVar9;
  Var pvVar10;
  char *message;
  char *error;
  uint lineNumber;
  undefined1 local_90 [8];
  uint32 index;
  CacheInfoFlag CStack_84;
  InlineCache *local_80;
  PolymorphicInlineCache *pPStack_78;
  FunctionBody *local_70;
  RecyclableObject *pRStack_68;
  PropertyRecordUsageCache *local_60;
  uint local_58;
  bool local_53;
  RecyclableObject *local_50;
  RecyclableObject *cacheOwner;
  PropertyRecordUsageCache *propertyRecordUsageCache;
  PropertyRecord *propertyRecord;
  Var value;
  
  BVar5 = IsObject(instance);
  if (BVar5 == 0) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec2e,L"in");
  }
  instance_00 = VarTo<Js::RecyclableObject>(instance);
  propertyRecordUsageCache = (PropertyRecordUsageCache *)0x0;
  bVar4 = GetPropertyRecordUsageCache
                    (argProperty,scriptContext,(PropertyRecordUsageCache **)&cacheOwner,&local_50);
  if (bVar4) {
    propertyRecordUsageCache =
         (PropertyRecordUsageCache *)
         (cacheOwner->super_FinalizableObject).super_IRecyclerVisitedObject.
         _vptr_IRecyclerVisitedObject;
    TVar1 = *(Type *)&(propertyRecordUsageCache->stElemInlineCache).ptr;
    if (TVar1 == false) {
      local_90 = (undefined1  [8])0x0;
      index._0_2_ = 0xffff;
      index._2_1_ = '\0';
      index._3_1_ = InlineCacheNoFlags;
      CStack_84 = defaultInfoFlags;
      local_80 = (InlineCache *)0x0;
      pPStack_78 = (PolymorphicInlineCache *)0x0;
      local_70 = (FunctionBody *)0x0;
      pRStack_68 = (RecyclableObject *)0x0;
      local_60 = (PropertyRecordUsageCache *)0x0;
      local_58 = 0xffffffff;
      local_53 = true;
      bVar4 = PropertyRecordUsageCache::TryGetPropertyFromCache<false,true,false>
                        ((PropertyRecordUsageCache *)cacheOwner,instance,instance_00,&propertyRecord
                         ,scriptContext,(PropertyValueInfo *)local_90,local_50,
                         (PropertyCacheOperationInfo *)0x0);
      if (bVar4) {
        bVar4 = VarIs<Js::JavascriptBoolean>(propertyRecord);
        if (!bVar4) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          error = "(VarIs<JavascriptBoolean>(value))";
          message = "VarIs<JavascriptBoolean>(value)";
          lineNumber = 0x1ecc;
LAB_00ac8ddb:
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,lineNumber,error,message);
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar8 = 0;
        }
      }
      else {
        BVar5 = GetPropertyWPCache<true,int>
                          (instance,instance_00,
                           *(int *)((cacheOwner->super_FinalizableObject).
                                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 1),
                           &propertyRecord,scriptContext,(PropertyValueInfo *)local_90);
        pPVar3 = propertyRecord;
        pPVar9 = (PropertyRecord *)JavascriptBoolean::ToVar(BVar5,scriptContext);
        if (pPVar3 != pPVar9) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          error = "(value == JavascriptBoolean::ToVar(result, scriptContext))";
          message = "value == JavascriptBoolean::ToVar(result, scriptContext)";
          lineNumber = 0x1ed0;
          goto LAB_00ac8ddb;
        }
      }
    }
    else {
      uVar6 = PropertyRecord::GetNumericValue((PropertyRecord *)propertyRecordUsageCache);
      propertyRecord = (PropertyRecord *)CONCAT44(extraout_var,uVar6);
      local_90._0_4_ = uVar6;
    }
    if (TVar1 == false) {
      return propertyRecord;
    }
  }
  else {
    pvVar10 = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)1>(argProperty,scriptContext);
    IVar7 = GetIndexTypeFromPrimitive
                      (pvVar10,scriptContext,(uint32 *)local_90,
                       (PropertyRecord **)&propertyRecordUsageCache,(JavascriptString **)0x0,true,
                       false);
    if (IVar7 != IndexType_Number) {
      BVar5 = HasProperty(instance_00,
                          *(PropertyId *)&(propertyRecordUsageCache->ldElemInlineCache).ptr);
      goto LAB_00ac8e02;
    }
  }
  BVar5 = HasItem(instance_00,local_90._0_4_);
LAB_00ac8e02:
  pvVar10 = JavascriptBoolean::ToVar(BVar5,scriptContext);
  return pvVar10;
}

Assistant:

Var JavascriptOperators::IsIn(Var argProperty, Var instance, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_IsIn);
        // Note that the fact that we haven't seen a given name before doesn't mean that the instance doesn't

        if (!IsObject(instance))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_Operand_Invalid_NeedObject, _u("in"));
        }

        RecyclableObject* object = VarTo<RecyclableObject>(instance);
        BOOL result;
        PropertyRecord const * propertyRecord = nullptr;
        uint32 index;
        IndexType indexType;

        // Fast path for JavascriptSymbols and PropertyStrings
        RecyclableObject* cacheOwner;
        PropertyRecordUsageCache* propertyRecordUsageCache;
        if (GetPropertyRecordUsageCache(argProperty, scriptContext, &propertyRecordUsageCache, &cacheOwner))
        {
            Var value;
            propertyRecord = propertyRecordUsageCache->GetPropertyRecord();
            if (!propertyRecord->IsNumeric())
            {
                PropertyValueInfo info;
                if (propertyRecordUsageCache->TryGetPropertyFromCache<false /* OwnPropertyOnly */, true /* OutputExistence */, false /* ReturnOperationInfo */>(instance, object, &value, scriptContext, &info, cacheOwner, nullptr))
                {
                    Assert(VarIs<JavascriptBoolean>(value));
                    return value;
                }
                result = JavascriptOperators::GetPropertyWPCache<true /* OutputExistence */>(instance, object, propertyRecordUsageCache->GetPropertyRecord()->GetPropertyId(), &value, scriptContext, &info);
                Assert(value == JavascriptBoolean::ToVar(result, scriptContext));
                return value;
            }

            // We don't cache numeric property lookups, so fall through to the IndexType_Number case
            index = propertyRecord->GetNumericValue();
            indexType = IndexType_Number;
        }
        else
        {
            indexType = GetIndexType(argProperty, scriptContext, &index, &propertyRecord, true);
        }

        if (indexType == IndexType_Number)
        {
            result = JavascriptOperators::HasItem(object, index);
        }
        else
        {
            result = JavascriptOperators::HasProperty(object, propertyRecord->GetPropertyId());

#ifdef TELEMETRY_JSO
            {
                Assert(indexType != Js::IndexType_JavascriptString);
                if (indexType == Js::IndexType_PropertyId)
                {
                    scriptContext->GetTelemetry().GetOpcodeTelemetry().IsIn(instance, propertyId, result != 0);
                }
            }
#endif
        }
        return JavascriptBoolean::ToVar(result, scriptContext);
        JIT_HELPER_END(Op_IsIn);
    }